

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

bool qt_is_ascii(char **ptr,char *end)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  byte bVar4;
  ushort uVar5;
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  char *pcVar8;
  uint idx;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  pauVar6 = (undefined1 (*) [16])*ptr + 1;
  pauVar7 = (undefined1 (*) [16])*ptr;
  while (pauVar6 <= end) {
    auVar2 = *pauVar7;
    uVar5 = (ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar2[0xf] >> 7) << 0xf;
    if (uVar5 != 0) {
      uVar10 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      goto LAB_003211aa;
    }
    *ptr = (char *)(pauVar7 + 1);
    pauVar6 = pauVar7 + 2;
    pauVar7 = pauVar7 + 1;
  }
  pauVar6 = (undefined1 (*) [16])(*pauVar7 + 8);
  if (pauVar6 <= end) {
    uVar1 = *(ulong *)*pauVar7;
    bVar4 = (byte)(uVar1 >> 7) & 1 | ((byte)(uVar1 >> 0xf) & 1) << 1 |
            ((byte)(uVar1 >> 0x17) & 1) << 2 | ((byte)(uVar1 >> 0x1f) & 1) << 3 |
            ((byte)(uVar1 >> 0x27) & 1) << 4 | ((byte)(uVar1 >> 0x2f) & 1) << 5 |
            ((byte)(uVar1 >> 0x37) & 1) << 6 | (byte)(uVar1 >> 0x38) & 0x80;
    if (bVar4 != 0) {
      uVar10 = 0;
      if (bVar4 != 0) {
        for (; (bVar4 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      pcVar8 = *pauVar7 + uVar10;
      goto LAB_003211ad;
    }
    *ptr = (char *)pauVar6;
    pauVar7 = pauVar6;
  }
  pcVar8 = *pauVar7 + 4;
  while( true ) {
    if (end < pcVar8) {
      if (pauVar7 == (undefined1 (*) [16])end) {
        return true;
      }
      do {
        bVar11 = (char)(*pauVar7)[0] < '\0';
        bVar3 = !bVar11;
        if (bVar11) {
          return bVar3;
        }
        pauVar7 = (undefined1 (*) [16])(*pauVar7 + 1);
        *ptr = (char *)pauVar7;
      } while (pauVar7 != (undefined1 (*) [16])end);
      return bVar3;
    }
    uVar9 = *(uint *)*pauVar7 & 0x80808080;
    if (uVar9 != 0) break;
    *ptr = (char *)(*pauVar7 + 4);
    pcVar8 = *pauVar7 + 8;
    pauVar7 = (undefined1 (*) [16])(*pauVar7 + 4);
  }
  uVar10 = 0;
  if (uVar9 != 0) {
    for (; (uVar9 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
    }
  }
  uVar10 = uVar10 >> 3;
LAB_003211aa:
  pcVar8 = *pauVar7 + uVar10;
LAB_003211ad:
  *ptr = pcVar8;
  return false;
}

Assistant:

bool qt_is_ascii(const char *&ptr, const char *end) noexcept
{
#if defined(__SSE2__)
    // Testing for the high bit can be done efficiently with just PMOVMSKB
    bool loops = true;
    if constexpr (UseAvx2) {
        while (ptr + 32 <= end) {
            __m256i data = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(ptr));
            quint32 mask = _mm256_movemask_epi8(data);
            if (mask) {
                uint idx = qCountTrailingZeroBits(mask);
                ptr += idx;
                return false;
            }
            ptr += 32;
        }
        loops = false;
    }

    while (ptr + 16 <= end) {
        __m128i data = _mm_loadu_si128(reinterpret_cast<const __m128i *>(ptr));
        quint32 mask = _mm_movemask_epi8(data);
        if (mask) {
            uint idx = qCountTrailingZeroBits(mask);
            ptr += idx;
            return false;
        }
        ptr += 16;

        if (!loops)
            break;
    }
    if (ptr + 8 <= end) {
        __m128i data = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(ptr));
        quint8 mask = _mm_movemask_epi8(data);
        if (mask) {
            uint idx = qCountTrailingZeroBits(mask);
            ptr += idx;
            return false;
        }
        ptr += 8;
    }
#endif

    while (ptr + 4 <= end) {
        quint32 data = qFromUnaligned<quint32>(ptr);
        if (data &= 0x80808080U) {
            uint idx = QSysInfo::ByteOrder == QSysInfo::BigEndian
                    ? qCountLeadingZeroBits(data)
                    : qCountTrailingZeroBits(data);
            ptr += idx / 8;
            return false;
        }
        ptr += 4;
    }

    while (ptr != end) {
        if (quint8(*ptr) & 0x80)
            return false;
        ++ptr;
    }
    return true;
}